

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_tec_fill(REF_EDGE ref_edge,char *filename)

{
  FILE *__stream;
  FILE *file;
  REF_INT edge;
  char *filename_local;
  REF_EDGE ref_edge_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x226,
           "ref_edge_tec_fill","unable to open file");
    ref_edge_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine edge fill\"\n");
    fprintf(__stream,"variables = \"i\" \"j\"\n");
    fprintf(__stream,"zone t=\"fill\", i=%d, datapacking=%s\n",(ulong)(uint)(ref_edge->n << 1),
            "point");
    for (file._4_4_ = 0; file._4_4_ < ref_edge->n; file._4_4_ = file._4_4_ + 1) {
      fprintf(__stream," %d %d\n",(ulong)(uint)ref_edge->e2n[file._4_4_ << 1],
              (ulong)(uint)ref_edge->e2n[file._4_4_ * 2 + 1]);
      fprintf(__stream," %d %d\n",(ulong)(uint)ref_edge->e2n[file._4_4_ * 2 + 1],
              (ulong)(uint)ref_edge->e2n[file._4_4_ << 1]);
    }
    fclose(__stream);
    ref_edge_local._4_4_ = 0;
  }
  return ref_edge_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_tec_fill(REF_EDGE ref_edge, const char *filename) {
  REF_INT edge;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine edge fill\"\n");
  fprintf(file, "variables = \"i\" \"j\"\n");

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n",
          2 * ref_edge_n(ref_edge), "point");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    fprintf(file, " %d %d\n", ref_edge_e2n(ref_edge, 0, edge),
            ref_edge_e2n(ref_edge, 1, edge));
    fprintf(file, " %d %d\n", ref_edge_e2n(ref_edge, 1, edge),
            ref_edge_e2n(ref_edge, 0, edge));
  }

  fclose(file);

  return REF_SUCCESS;
}